

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_path.cpp
# Opt level: O2

ScalarFunctionSet * duckdb::ParsePathFun::GetFunctions(void)

{
  vector<duckdb::ScalarFunction,_true> *this;
  LogicalType varargs;
  ScalarFunctionSet *in_RDI;
  initializer_list<duckdb::LogicalType> __l;
  undefined4 in_stack_fffffffffffffbc4;
  undefined4 in_stack_fffffffffffffbcc;
  FunctionNullHandling in_stack_fffffffffffffbd8;
  allocator_type local_421;
  code *bind_lambda;
  LogicalType local_400;
  LogicalType local_3e8;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_3d0;
  LogicalType varchar_list_type;
  LogicalType local_3a0;
  ScalarFunction func;
  ScalarFunction local_260;
  ScalarFunction local_138;
  
  LogicalType::LogicalType((LogicalType *)&func,VARCHAR);
  LogicalType::LIST(&varchar_list_type,(LogicalType *)&func);
  LogicalType::~LogicalType((LogicalType *)&func);
  ScalarFunctionSet::ScalarFunctionSet(in_RDI);
  LogicalType::LogicalType(&local_3e8,VARCHAR);
  __l._M_len = 1;
  __l._M_array = &local_3e8;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_3d0,__l,&local_421);
  LogicalType::LogicalType(&local_400,&varchar_list_type);
  bind_lambda = ParsePathFunction;
  LogicalType::LogicalType(&local_3a0,INVALID);
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._0_4_ = 0;
  varargs._0_8_ = &local_3a0;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._4_4_ = in_stack_fffffffffffffbc4;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_4_ = 1;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = in_stack_fffffffffffffbcc;
  ScalarFunction::ScalarFunction
            (&func,(vector<duckdb::LogicalType,_true> *)&local_3d0,&local_400,
             (scalar_function_t *)&stack0xfffffffffffffbe0,(bind_scalar_function_t)0x0,
             (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,(init_local_state_t)0x0
             ,varargs,CONSISTENT,in_stack_fffffffffffffbd8,bind_lambda);
  LogicalType::~LogicalType(&local_3a0);
  ::std::_Function_base::~_Function_base((_Function_base *)&stack0xfffffffffffffbe0);
  LogicalType::~LogicalType(&local_400);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_3d0);
  LogicalType::~LogicalType(&local_3e8);
  ScalarFunction::ScalarFunction(&local_138,&func);
  this = &(in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions;
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_138);
  ScalarFunction::~ScalarFunction(&local_138);
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)
             &func.super_BaseScalarFunction.super_SimpleFunction.arguments,&LogicalType::VARCHAR);
  ScalarFunction::ScalarFunction(&local_260,&func);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_260);
  ScalarFunction::~ScalarFunction(&local_260);
  ScalarFunction::~ScalarFunction(&func);
  LogicalType::~LogicalType(&varchar_list_type);
  return in_RDI;
}

Assistant:

ScalarFunctionSet ParsePathFun::GetFunctions() {
	auto varchar_list_type = LogicalType::LIST(LogicalType::VARCHAR);
	ScalarFunctionSet parse_path;
	ScalarFunction func({LogicalType::VARCHAR}, varchar_list_type, ParsePathFunction, nullptr, nullptr, nullptr,
	                    nullptr, LogicalType::INVALID, FunctionStability::CONSISTENT,
	                    FunctionNullHandling::SPECIAL_HANDLING);
	parse_path.AddFunction(func);
	// separator options
	func.arguments.emplace_back(LogicalType::VARCHAR);
	parse_path.AddFunction(func);
	return parse_path;
}